

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O0

void __thiscall r_comp::RepliStruct::RepliStruct(RepliStruct *this,Type type)

{
  Type type_local;
  RepliStruct *this_local;
  
  std::__cxx11::string::string((string *)&this->cmd);
  std::__cxx11::string::string((string *)&this->tail);
  std::__cxx11::string::string((string *)&this->label);
  std::__cxx11::string::string((string *)&this->error);
  std::__cxx11::string::string((string *)&this->fileName);
  std::
  vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  ::vector(&this->args);
  this->type = type;
  std::__cxx11::string::operator=((string *)&this->fileName,(string *)GlobalFilename_abi_cxx11_);
  this->line = GlobalLine;
  this->parent = (RepliStruct *)0x0;
  return;
}

Assistant:

RepliStruct::RepliStruct(RepliStruct::Type type)
{
    //    std::cout << "creating strucT: " << GlobalFilename << GlobalLine << std::endl;
    this->type = type;
    this->fileName = GlobalFilename;
    line = GlobalLine;
    parent = nullptr;
}